

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstate.c
# Opt level: O0

void luaE_freethread(lua_State *L,lua_State *L1)

{
  LX *l;
  lua_State *L1_local;
  lua_State *L_local;
  
  luaF_closeupval(L1,(L1->stack).p);
  freestack(L1);
  luaM_free_(L,&L1[-1].transferinfo,0xd8);
  return;
}

Assistant:

void luaE_freethread (lua_State *L, lua_State *L1) {
  LX *l = fromstate(L1);
  luaF_closeupval(L1, L1->stack.p);  /* close all upvalues */
  lua_assert(L1->openupval == NULL);
  luai_userstatefree(L, L1);
  freestack(L1);
  luaM_free(L, l);
}